

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O1

int mbedtls_pkcs5_self_test(int verbose)

{
  uint key_length;
  int iVar1;
  mbedtls_md_info_t *md_info;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uchar (*local_98) [40];
  mbedtls_md_context_t sha1_ctx;
  uchar key [64];
  
  mbedtls_md_init(&sha1_ctx);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  if (md_info == (mbedtls_md_info_t *)0x0) {
LAB_0014d523:
    iVar2 = 1;
  }
  else {
    iVar2 = 1;
    iVar1 = mbedtls_md_setup(&sha1_ctx,md_info,1);
    if (iVar1 == 0) {
      local_98 = salt_test_data;
      lVar4 = 0;
      lVar6 = 0;
      lVar3 = 0;
      uVar5 = 0;
      do {
        if (verbose != 0) {
          printf("  PBKDF2 (SHA1) #%d: ",uVar5);
        }
        key_length = *(uint *)((long)key_len_test_data + lVar6);
        iVar1 = mbedtls_pkcs5_pbkdf2_hmac
                          (&sha1_ctx,password_test_data[0] + lVar3,
                           *(size_t *)((long)plen_test_data + lVar4),*local_98,
                           *(size_t *)((long)slen_test_data + lVar4),
                           *(uint *)((long)it_cnt_test_data + lVar6),key_length,key);
        if (iVar1 != 0) {
LAB_0014d510:
          if (verbose != 0) {
            puts("failed");
          }
          goto LAB_0014d523;
        }
        iVar1 = bcmp(result_key_test_data[0] + lVar3,key,(ulong)key_length);
        if (iVar1 != 0) goto LAB_0014d510;
        if (verbose != 0) {
          puts("passed");
        }
        uVar5 = (ulong)((int)uVar5 + 1);
        lVar3 = lVar3 + 0x20;
        lVar6 = lVar6 + 4;
        lVar4 = lVar4 + 8;
        local_98 = local_98 + 1;
      } while (lVar3 != 0xc0);
      iVar2 = 0;
      if (verbose != 0) {
        putchar(10);
      }
    }
  }
  mbedtls_md_free(&sha1_ctx);
  return iVar2;
}

Assistant:

int mbedtls_pkcs5_self_test( int verbose )
{
    mbedtls_md_context_t sha1_ctx;
    const mbedtls_md_info_t *info_sha1;
    int ret, i;
    unsigned char key[64];

    mbedtls_md_init( &sha1_ctx );

    info_sha1 = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 );
    if( info_sha1 == NULL )
    {
        ret = 1;
        goto exit;
    }

    if( ( ret = mbedtls_md_setup( &sha1_ctx, info_sha1, 1 ) ) != 0 )
    {
        ret = 1;
        goto exit;
    }

    for( i = 0; i < MAX_TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  PBKDF2 (SHA1) #%d: ", i );

        ret = mbedtls_pkcs5_pbkdf2_hmac( &sha1_ctx, password_test_data[i],
                                         plen_test_data[i], salt_test_data[i],
                                         slen_test_data[i], it_cnt_test_data[i],
                                         key_len_test_data[i], key );
        if( ret != 0 ||
            memcmp( result_key_test_data[i], key, key_len_test_data[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_md_free( &sha1_ctx );

    return( ret );
}